

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<FunctionCallStatementNode,_std::default_delete<FunctionCallStatementNode>_> __thiscall
Parser::parseLambdaCallStatement(Parser *this)

{
  Mark MVar1;
  Mark *pMVar2;
  Stream *in_RSI;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string local_38;
  
  pMVar2 = Stream::getMark(in_RSI);
  MVar1 = *pMVar2;
  parseLambdaCall((Parser *)local_40,SUB81(in_RSI,0));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_40 + 8),"Expected semicolon!",&local_41);
  expectToken((Parser *)in_RSI,Semicolon,(string *)(local_40 + 8));
  std::__cxx11::string::~string((string *)(local_40 + 8));
  std::
  make_unique<FunctionCallStatementNode,std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>>
            ((unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> *)this);
  *(Mark *)((this->tokenizer_).stream_.is_ + 8) = MVar1;
  if (local_40 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_40 + 8))();
  }
  return (__uniq_ptr_data<FunctionCallStatementNode,_std::default_delete<FunctionCallStatementNode>,_true,_true>
          )(__uniq_ptr_data<FunctionCallStatementNode,_std::default_delete<FunctionCallStatementNode>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<FunctionCallStatementNode> Parser::parseLambdaCallStatement()
{
  const auto mark = tokenizer_.getMark();
  auto lambdaCall = parseLambdaCall();
  expectToken(TokenType::Semicolon, "Expected semicolon!");
  auto node = std::make_unique<FunctionCallStatementNode>(std::move(lambdaCall));
  node->setMark(mark);
  return node;
}